

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qabstractbutton.cpp
# Opt level: O2

void QAbstractButton::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QSize QVar1;
  QSize QVar2;
  bool bVar3;
  undefined4 uVar4;
  long lVar5;
  QSize QVar6;
  byte bVar7;
  undefined1 uVar8;
  byte bVar9;
  QSize *pQVar10;
  long in_FS_OFFSET;
  undefined1 local_38 [16];
  QSize local_28;
  QWidgetData *local_18;
  
  local_18 = *(QWidgetData **)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        pressed((QAbstractButton *)_o);
        return;
      }
      break;
    case 1:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        released((QAbstractButton *)_o);
        return;
      }
      break;
    case 2:
      uVar8 = *_a[1];
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
LAB_0039cc01:
        clicked((QAbstractButton *)_o,(bool)uVar8);
        return;
      }
      break;
    case 3:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        uVar8 = false;
        goto LAB_0039cc01;
      }
      break;
    case 4:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        toggled((QAbstractButton *)_o,*_a[1]);
        return;
      }
      break;
    case 5:
      pQVar10 = (QSize *)_a[1];
switchD_0039ca88_caseD_2:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setIconSize((QAbstractButton *)_o,pQVar10);
        return;
      }
      break;
    case 6:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        animateClick((QAbstractButton *)_o);
        return;
      }
      break;
    case 7:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        click((QAbstractButton *)_o);
        return;
      }
      break;
    case 8:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        toggle((QAbstractButton *)_o);
        return;
      }
      break;
    case 9:
      uVar8 = *_a[1];
LAB_0039cd86:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setChecked((QAbstractButton *)_o,(bool)uVar8);
        return;
      }
      break;
    default:
      goto switchD_0039ca2a_caseD_3;
    }
    goto LAB_0039ceb7;
  case ReadProperty:
    if (10 < (uint)_id) goto switchD_0039ca2a_caseD_3;
    break;
  case WriteProperty:
    if (10 < (uint)_id) goto switchD_0039ca2a_caseD_3;
    pQVar10 = (QSize *)*_a;
    switch(_id) {
    case 0:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setText((QAbstractButton *)_o,(QString *)pQVar10);
        return;
      }
      break;
    case 1:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setIcon((QAbstractButton *)_o,(QIcon *)pQVar10);
        return;
      }
      break;
    case 2:
      goto switchD_0039ca88_caseD_2;
    case 3:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setShortcut((QAbstractButton *)_o,(QKeySequence *)pQVar10);
        return;
      }
      break;
    case 4:
      bVar7 = (byte)(pQVar10->wd).m_i;
      lVar5 = *(long *)(_o + 8);
      if (((*(byte *)(lVar5 + 0x28c) ^ bVar7) & 1) != 0) {
        bVar9 = *(byte *)(lVar5 + 0x28c) & 0xfc;
        goto LAB_0039cd58;
      }
      goto switchD_0039ca2a_caseD_3;
    case 5:
      uVar8 = (undefined1)(pQVar10->wd).m_i;
      goto LAB_0039cd86;
    case 6:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setAutoRepeat((QAbstractButton *)_o,SUB41((pQVar10->wd).m_i,0));
        return;
      }
      break;
    case 7:
      lVar5 = *(long *)(_o + 8);
      bVar7 = (char)(pQVar10->wd).m_i << 3;
      bVar9 = *(byte *)(lVar5 + 0x28c) & 0xf7;
LAB_0039cd58:
      *(byte *)(lVar5 + 0x28c) = bVar9 | bVar7;
      goto switchD_0039ca2a_caseD_3;
    case 8:
      *(int *)(*(long *)(_o + 8) + 0x2a0) = (pQVar10->wd).m_i;
      goto switchD_0039ca2a_caseD_3;
    case 9:
      *(int *)(*(long *)(_o + 8) + 0x2a4) = (pQVar10->wd).m_i;
      goto switchD_0039ca2a_caseD_3;
    case 10:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setDown((QAbstractButton *)_o,SUB41((pQVar10->wd).m_i,0));
        return;
      }
    }
    goto LAB_0039ceb7;
  default:
    goto switchD_0039ca2a_caseD_3;
  case IndexOfMethod:
    bVar3 = QtMocHelpers::indexOfMethod<void(QAbstractButton::*)()>
                      ((QtMocHelpers *)_a,(void **)pressed,0,0);
    if (((!bVar3) &&
        (bVar3 = QtMocHelpers::indexOfMethod<void(QAbstractButton::*)()>
                           ((QtMocHelpers *)_a,(void **)released,0,1), !bVar3)) &&
       (bVar3 = QtMocHelpers::indexOfMethod<void(QAbstractButton::*)(bool)>
                          ((QtMocHelpers *)_a,(void **)clicked,0,2), !bVar3)) {
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        QtMocHelpers::indexOfMethod<void(QAbstractButton::*)(bool)>
                  ((QtMocHelpers *)_a,(void **)toggled,0,4);
        return;
      }
      goto LAB_0039ceb7;
    }
    goto switchD_0039ca2a_caseD_3;
  }
  pQVar10 = (QSize *)*_a;
  switch(_id) {
  case 0:
    text((QString *)local_38,(QAbstractButton *)_o);
    QVar1 = *pQVar10;
    QVar2 = pQVar10[1];
    pQVar10->wd = (Representation)local_38._0_4_;
    pQVar10->ht = (Representation)local_38._4_4_;
    pQVar10[1].wd = (Representation)local_38._8_4_;
    pQVar10[1].ht = (Representation)local_38._12_4_;
    QVar6 = pQVar10[2];
    pQVar10[2] = local_28;
    local_38._0_8_ = QVar1;
    local_38._8_8_ = QVar2;
    local_28 = QVar6;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_38);
    break;
  case 1:
    icon((QAbstractButton *)local_38);
    QIcon::operator=((QIcon *)pQVar10,(QIcon *)local_38);
    QIcon::~QIcon((QIcon *)local_38);
    break;
  case 2:
    QVar6 = iconSize((QAbstractButton *)_o);
    *pQVar10 = QVar6;
    break;
  case 3:
    shortcut((QAbstractButton *)local_38);
    pQVar10->wd = (Representation)local_38._0_4_;
    pQVar10->ht = (Representation)local_38._4_4_;
    local_38._0_8_ = *pQVar10;
    QKeySequence::~QKeySequence((QKeySequence *)local_38);
    break;
  case 4:
    bVar7 = *(byte *)(*(long *)(_o + 8) + 0x28c);
    goto LAB_0039ce8d;
  case 5:
    bVar7 = *(byte *)(*(long *)(_o + 8) + 0x28c) >> 1;
    goto LAB_0039ce8d;
  case 6:
    bVar7 = *(byte *)(*(long *)(_o + 8) + 0x28c) >> 2;
    goto LAB_0039ce8d;
  case 7:
    bVar7 = *(byte *)(*(long *)(_o + 8) + 0x28c) >> 3;
    goto LAB_0039ce8d;
  case 8:
    uVar4 = *(undefined4 *)(*(long *)(_o + 8) + 0x2a0);
    goto LAB_0039ce9d;
  case 9:
    uVar4 = *(undefined4 *)(*(long *)(_o + 8) + 0x2a4);
LAB_0039ce9d:
    (pQVar10->wd).m_i = uVar4;
    break;
  case 10:
    bVar7 = *(byte *)(*(long *)(_o + 8) + 0x28c) >> 4;
LAB_0039ce8d:
    *(byte *)&(pQVar10->wd).m_i = bVar7 & 1;
  }
switchD_0039ca2a_caseD_3:
  if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_0039ceb7:
  __stack_chk_fail();
}

Assistant:

void QAbstractButton::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QAbstractButton *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->pressed(); break;
        case 1: _t->released(); break;
        case 2: _t->clicked((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 3: _t->clicked(); break;
        case 4: _t->toggled((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 5: _t->setIconSize((*reinterpret_cast< std::add_pointer_t<QSize>>(_a[1]))); break;
        case 6: _t->animateClick(); break;
        case 7: _t->click(); break;
        case 8: _t->toggle(); break;
        case 9: _t->setChecked((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QAbstractButton::*)()>(_a, &QAbstractButton::pressed, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractButton::*)()>(_a, &QAbstractButton::released, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractButton::*)(bool )>(_a, &QAbstractButton::clicked, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractButton::*)(bool )>(_a, &QAbstractButton::toggled, 4))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QString*>(_v) = _t->text(); break;
        case 1: *reinterpret_cast<QIcon*>(_v) = _t->icon(); break;
        case 2: *reinterpret_cast<QSize*>(_v) = _t->iconSize(); break;
        case 3: *reinterpret_cast<QKeySequence*>(_v) = _t->shortcut(); break;
        case 4: *reinterpret_cast<bool*>(_v) = _t->isCheckable(); break;
        case 5: *reinterpret_cast<bool*>(_v) = _t->isChecked(); break;
        case 6: *reinterpret_cast<bool*>(_v) = _t->autoRepeat(); break;
        case 7: *reinterpret_cast<bool*>(_v) = _t->autoExclusive(); break;
        case 8: *reinterpret_cast<int*>(_v) = _t->autoRepeatDelay(); break;
        case 9: *reinterpret_cast<int*>(_v) = _t->autoRepeatInterval(); break;
        case 10: *reinterpret_cast<bool*>(_v) = _t->isDown(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setText(*reinterpret_cast<QString*>(_v)); break;
        case 1: _t->setIcon(*reinterpret_cast<QIcon*>(_v)); break;
        case 2: _t->setIconSize(*reinterpret_cast<QSize*>(_v)); break;
        case 3: _t->setShortcut(*reinterpret_cast<QKeySequence*>(_v)); break;
        case 4: _t->setCheckable(*reinterpret_cast<bool*>(_v)); break;
        case 5: _t->setChecked(*reinterpret_cast<bool*>(_v)); break;
        case 6: _t->setAutoRepeat(*reinterpret_cast<bool*>(_v)); break;
        case 7: _t->setAutoExclusive(*reinterpret_cast<bool*>(_v)); break;
        case 8: _t->setAutoRepeatDelay(*reinterpret_cast<int*>(_v)); break;
        case 9: _t->setAutoRepeatInterval(*reinterpret_cast<int*>(_v)); break;
        case 10: _t->setDown(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}